

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O0

LanguageBreakEngine * __thiscall
icu_63::ICULanguageBreakFactory::loadEngineFor(ICULanguageBreakFactory *this,UChar32 c)

{
  UBool UVar1;
  UScriptCode UVar2;
  int iVar3;
  undefined4 extraout_var;
  ThaiBreakEngine *pTVar4;
  size_t size;
  ThaiBreakEngine *local_110;
  ThaiBreakEngine *local_100;
  ThaiBreakEngine *local_f0;
  ThaiBreakEngine *local_e0;
  ThaiBreakEngine *local_d0;
  ThaiBreakEngine *local_c0;
  ThaiBreakEngine *local_38;
  LanguageBreakEngine *engine;
  DictionaryMatcher *m;
  UErrorCode local_20;
  UScriptCode code;
  UErrorCode status;
  UChar32 c_local;
  ICULanguageBreakFactory *this_local;
  DictionaryMatcher *adoptDictionary;
  
  local_20 = U_ZERO_ERROR;
  code = c;
  _status = this;
  UVar2 = uscript_getScript_63(c,&local_20);
  UVar1 = ::U_SUCCESS(local_20);
  if (UVar1 != '\0') {
    size = (size_t)(uint)UVar2;
    iVar3 = (*(this->super_LanguageBreakFactory)._vptr_LanguageBreakFactory[4])();
    adoptDictionary = (DictionaryMatcher *)CONCAT44(extraout_var,iVar3);
    if (adoptDictionary != (DictionaryMatcher *)0x0) {
      local_38 = (ThaiBreakEngine *)0x0;
      switch(UVar2) {
      case USCRIPT_HAN:
      case USCRIPT_HIRAGANA:
      case USCRIPT_KATAKANA:
        pTVar4 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1d0,size);
        local_110 = (ThaiBreakEngine *)0x0;
        if (pTVar4 != (ThaiBreakEngine *)0x0) {
          CjkBreakEngine::CjkBreakEngine
                    ((CjkBreakEngine *)pTVar4,adoptDictionary,kChineseJapanese,&local_20);
          local_110 = pTVar4;
        }
        local_38 = local_110;
        break;
      case USCRIPT_HANGUL:
        pTVar4 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1d0,size);
        local_100 = (ThaiBreakEngine *)0x0;
        if (pTVar4 != (ThaiBreakEngine *)0x0) {
          CjkBreakEngine::CjkBreakEngine((CjkBreakEngine *)pTVar4,adoptDictionary,kKorean,&local_20)
          ;
          local_100 = pTVar4;
        }
        local_38 = local_100;
        break;
      default:
        break;
      case USCRIPT_KHMER:
        pTVar4 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1c8,size);
        local_f0 = (ThaiBreakEngine *)0x0;
        if (pTVar4 != (ThaiBreakEngine *)0x0) {
          KhmerBreakEngine::KhmerBreakEngine((KhmerBreakEngine *)pTVar4,adoptDictionary,&local_20);
          local_f0 = pTVar4;
        }
        local_38 = local_f0;
        break;
      case USCRIPT_LAO:
        pTVar4 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1c8,size);
        local_d0 = (ThaiBreakEngine *)0x0;
        if (pTVar4 != (ThaiBreakEngine *)0x0) {
          LaoBreakEngine::LaoBreakEngine((LaoBreakEngine *)pTVar4,adoptDictionary,&local_20);
          local_d0 = pTVar4;
        }
        local_38 = local_d0;
        break;
      case USCRIPT_MYANMAR:
        pTVar4 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1c8,size);
        local_e0 = (ThaiBreakEngine *)0x0;
        if (pTVar4 != (ThaiBreakEngine *)0x0) {
          BurmeseBreakEngine::BurmeseBreakEngine
                    ((BurmeseBreakEngine *)pTVar4,adoptDictionary,&local_20);
          local_e0 = pTVar4;
        }
        local_38 = local_e0;
        break;
      case USCRIPT_THAI:
        pTVar4 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x220,size);
        local_c0 = (ThaiBreakEngine *)0x0;
        if (pTVar4 != (ThaiBreakEngine *)0x0) {
          ThaiBreakEngine::ThaiBreakEngine(pTVar4,adoptDictionary,&local_20);
          local_c0 = pTVar4;
        }
        local_38 = local_c0;
      }
      if (local_38 == (ThaiBreakEngine *)0x0) {
        if (adoptDictionary != (DictionaryMatcher *)0x0) {
          (*adoptDictionary->_vptr_DictionaryMatcher[1])();
        }
      }
      else {
        UVar1 = ::U_FAILURE(local_20);
        if (UVar1 != '\0') {
          if (local_38 != (ThaiBreakEngine *)0x0) {
            (*(local_38->super_DictionaryBreakEngine).super_LanguageBreakEngine.
              _vptr_LanguageBreakEngine[1])();
          }
          local_38 = (ThaiBreakEngine *)0x0;
        }
      }
      return (LanguageBreakEngine *)local_38;
    }
  }
  return (LanguageBreakEngine *)0x0;
}

Assistant:

const LanguageBreakEngine *
ICULanguageBreakFactory::loadEngineFor(UChar32 c) {
    UErrorCode status = U_ZERO_ERROR;
    UScriptCode code = uscript_getScript(c, &status);
    if (U_SUCCESS(status)) {
        DictionaryMatcher *m = loadDictionaryMatcherFor(code);
        if (m != NULL) {
            const LanguageBreakEngine *engine = NULL;
            switch(code) {
            case USCRIPT_THAI:
                engine = new ThaiBreakEngine(m, status);
                break;
            case USCRIPT_LAO:
                engine = new LaoBreakEngine(m, status);
                break;
            case USCRIPT_MYANMAR:
                engine = new BurmeseBreakEngine(m, status);
                break;
            case USCRIPT_KHMER:
                engine = new KhmerBreakEngine(m, status);
                break;

#if !UCONFIG_NO_NORMALIZATION
                // CJK not available w/o normalization
            case USCRIPT_HANGUL:
                engine = new CjkBreakEngine(m, kKorean, status);
                break;

            // use same BreakEngine and dictionary for both Chinese and Japanese
            case USCRIPT_HIRAGANA:
            case USCRIPT_KATAKANA:
            case USCRIPT_HAN:
                engine = new CjkBreakEngine(m, kChineseJapanese, status);
                break;
#if 0
            // TODO: Have to get some characters with script=common handled
            // by CjkBreakEngine (e.g. U+309B). Simply subjecting
            // them to CjkBreakEngine does not work. The engine has to
            // special-case them.
            case USCRIPT_COMMON:
            {
                UBlockCode block = ublock_getCode(code);
                if (block == UBLOCK_HIRAGANA || block == UBLOCK_KATAKANA)
                   engine = new CjkBreakEngine(dict, kChineseJapanese, status);
                break;
            }
#endif
#endif

            default:
                break;
            }
            if (engine == NULL) {
                delete m;
            }
            else if (U_FAILURE(status)) {
                delete engine;
                engine = NULL;
            }
            return engine;
        }
    }
    return NULL;
}